

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IAnimatedMesh * __thiscall
irr::scene::CSceneManager::getUncachedMesh
          (CSceneManager *this,IReadFile *file,path *filename,path *cachename)

{
  u32 uVar1;
  uint uVar2;
  int iVar3;
  IMeshLoader **ppIVar4;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  IReferenceCounted *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x;
  s32 i;
  s32 count;
  IAnimatedMesh *msh;
  u32 uVar5;
  IAnimatedMesh *local_28;
  
  local_28 = (IAnimatedMesh *)0x0;
  uVar1 = core::array<irr::scene::IMeshLoader_*>::size((array<irr::scene::IMeshLoader_*> *)0x2fa1b6)
  ;
  __x = extraout_XMM0_Qa;
  uVar5 = uVar1;
  do {
    do {
      uVar5 = uVar5 - 1;
      if ((int)uVar5 < 0) goto LAB_002fa27a;
      ppIVar4 = core::array<irr::scene::IMeshLoader_*>::operator[]
                          ((array<irr::scene::IMeshLoader_*> *)CONCAT44(uVar1,uVar5),
                           (u32)((ulong)in_RDI >> 0x20));
      uVar2 = (*(*ppIVar4)->_vptr_IMeshLoader[2])(*ppIVar4,in_RDX);
      __x = extraout_XMM0_Qa_00;
    } while ((uVar2 & 1) == 0);
    (**(code **)(*in_RSI + 8))(in_RSI,0,0);
    ppIVar4 = core::array<irr::scene::IMeshLoader_*>::operator[]
                        ((array<irr::scene::IMeshLoader_*> *)CONCAT44(uVar1,uVar5),
                         (u32)((ulong)in_RDI >> 0x20));
    iVar3 = (*(*ppIVar4)->_vptr_IMeshLoader[3])(*ppIVar4,in_RSI);
    local_28 = (IAnimatedMesh *)CONCAT44(extraout_var,iVar3);
    __x = extraout_XMM0_Qa_01;
  } while (local_28 == (IAnimatedMesh *)0x0);
  (**(code **)(*(long *)in_RDI[0x17].DebugName + 0x10))(in_RDI[0x17].DebugName,in_RCX,local_28);
  IReferenceCounted::drop(in_RDI);
  __x = extraout_XMM0_Qa_02;
LAB_002fa27a:
  if (local_28 == (IAnimatedMesh *)0x0) {
    os::Printer::log(__x);
  }
  else {
    os::Printer::log(__x);
  }
  return local_28;
}

Assistant:

IAnimatedMesh *CSceneManager::getUncachedMesh(io::IReadFile *file, const io::path &filename, const io::path &cachename)
{
	IAnimatedMesh *msh = 0;

	// iterate the list in reverse order so user-added loaders can override the built-in ones
	s32 count = MeshLoaderList.size();
	for (s32 i = count - 1; i >= 0; --i) {
		if (MeshLoaderList[i]->isALoadableFileExtension(filename)) {
			// reset file to avoid side effects of previous calls to createMesh
			file->seek(0);
			msh = MeshLoaderList[i]->createMesh(file);
			if (msh) {
				MeshCache->addMesh(cachename, msh);
				msh->drop();
				break;
			}
		}
	}

	if (!msh)
		os::Printer::log("Could not load mesh, file format seems to be unsupported", filename, ELL_ERROR);
	else
		os::Printer::log("Loaded mesh", filename, ELL_DEBUG);

	return msh;
}